

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CXMLReaderImpl.h
# Opt level: O0

void __thiscall
irr::io::CXMLReaderImpl<unsigned_long,_irr::io::IXMLBase>::createSpecialCharacterList
          (CXMLReaderImpl<unsigned_long,_irr::io::IXMLBase> *this)

{
  string<unsigned_long> local_70;
  string<unsigned_long> local_60;
  string<unsigned_long> local_50;
  string<unsigned_long> local_40 [2];
  string<unsigned_long> local_20;
  CXMLReaderImpl<unsigned_long,_irr::io::IXMLBase> *local_10;
  CXMLReaderImpl<unsigned_long,_irr::io::IXMLBase> *this_local;
  
  local_10 = this;
  core::string<unsigned_long>::string<char>(&local_20,"&amp;");
  core::array<irr::core::string<unsigned_long>_>::push_back(&this->SpecialCharacters,&local_20);
  core::string<unsigned_long>::~string(&local_20);
  core::string<unsigned_long>::string<char>(local_40,"<lt;");
  core::array<irr::core::string<unsigned_long>_>::push_back(&this->SpecialCharacters,local_40);
  core::string<unsigned_long>::~string(local_40);
  core::string<unsigned_long>::string<char>(&local_50,">gt;");
  core::array<irr::core::string<unsigned_long>_>::push_back(&this->SpecialCharacters,&local_50);
  core::string<unsigned_long>::~string(&local_50);
  core::string<unsigned_long>::string<char>(&local_60,"\"quot;");
  core::array<irr::core::string<unsigned_long>_>::push_back(&this->SpecialCharacters,&local_60);
  core::string<unsigned_long>::~string(&local_60);
  core::string<unsigned_long>::string<char>(&local_70,"\'apos;");
  core::array<irr::core::string<unsigned_long>_>::push_back(&this->SpecialCharacters,&local_70);
  core::string<unsigned_long>::~string(&local_70);
  return;
}

Assistant:

void createSpecialCharacterList()
	{
		// list of strings containing special symbols, 
		// the first character is the special character,
		// the following is the symbol string without trailing &.

		SpecialCharacters.push_back("&amp;");
		SpecialCharacters.push_back("<lt;");
		SpecialCharacters.push_back(">gt;");
		SpecialCharacters.push_back("\"quot;");
		SpecialCharacters.push_back("'apos;");
		
	}